

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

String * Lexer::DescribeTokenPrivate(String *__return_storage_ptr__,Token tokType,TokenInfo *tok)

{
  undefined1 *puVar1;
  pointer pcVar2;
  String *pSVar3;
  ulong uVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  char *pcVar6;
  char *pcVar7;
  string local_88 [4];
  char local_78 [16];
  String local_68;
  String local_48;
  
  if ((int)tokType < 0x49) {
    uVar4 = (ulong)_local_88 >> 0x20;
    LexerScanner::GetTokenString((Token)uVar4);
    _local_88 = local_78;
    std::__cxx11::string::_M_construct<char_const*>(local_88,"\"","");
    String::operator+(&local_68,(String *)local_88,&local_48);
    if (_local_88 != local_78) {
      operator_delete(_local_88);
    }
    String::operator+(__return_storage_ptr__,&local_68,"\"");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._string._M_dataplus._M_p != &local_68._string.field_2) {
      operator_delete(local_68._string._M_dataplus._M_p);
    }
    pSVar3 = &local_48;
LAB_0011f150:
    paVar5 = &(pSVar3->_string).field_2;
    puVar1 = *(undefined1 **)(paVar5->_M_local_buf + -0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar1 != paVar5) {
      operator_delete(puVar1);
    }
  }
  else {
    switch(tokType) {
    case Symbol:
      if (tok != (TokenInfo *)0x0) {
LAB_0011f22d:
        (__return_storage_ptr__->_string)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->_string).field_2;
        pcVar2 = (tok->text)._string._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar2,
                   pcVar2 + (tok->text)._string._M_string_length);
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->_string)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->_string).field_2;
      pcVar7 = "a symbol";
      pcVar6 = "";
      break;
    case Number:
      if (tok != (TokenInfo *)0x0) goto LAB_0011f22d;
      (__return_storage_ptr__->_string)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->_string).field_2;
      pcVar7 = "a number";
      pcVar6 = "";
      break;
    case String:
      if (tok == (TokenInfo *)0x0) {
        (__return_storage_ptr__->_string)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->_string).field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"a string","");
      }
      else {
        _local_88 = local_78;
        std::__cxx11::string::_M_construct<char_const*>(local_88,"\"","");
        String::operator+(&local_68,(String *)local_88,&tok->text);
        if (_local_88 != local_78) {
          operator_delete(_local_88);
        }
        String::operator+(__return_storage_ptr__,&local_68,"\"");
      }
      if (tok == (TokenInfo *)0x0) {
        return __return_storage_ptr__;
      }
      pSVar3 = &local_68;
      goto LAB_0011f150;
    case Any:
      if (tok != (TokenInfo *)0x0) goto LAB_0011f22d;
      (__return_storage_ptr__->_string)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->_string).field_2;
      pcVar7 = "any token";
      pcVar6 = "";
      break;
    default:
      (__return_storage_ptr__->_string)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->_string).field_2;
      pcVar6 = "";
      pcVar7 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar7,pcVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

String Lexer::DescribeTokenPrivate (Token tokType, Lexer::TokenInfo* tok)
{
	if (tokType < LastNamedToken)
		return "\"" + LexerScanner::GetTokenString (tokType) + "\"";

	switch (tokType)
	{
		case Token::Symbol:	return tok ? tok->text : "a symbol";
		case Token::Number:	return tok ? tok->text : "a number";
		case Token::String:	return tok ? ("\"" + tok->text + "\"") : "a string";
		case Token::Any:	return tok ? tok->text : "any token";
		default: break;
	}

	return "";
}